

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Translator * __thiscall
helics::ConnectorFederateManager::registerTranslator
          (ConnectorFederateManager *this,string_view name,string_view endpointType,
          string_view units)

{
  Translator **ppTVar1;
  pointer this_00;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  RegistrationFailure *this_01;
  char *pcVar4;
  long lVar5;
  Translator *pTVar6;
  size_t sVar7;
  string_view searchValue;
  string_view message;
  handle trans;
  InterfaceHandle local_54;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  handle local_40;
  
  pcVar4 = name._M_str;
  sVar7 = name._M_len;
  local_50._M_len = sVar7;
  local_50._M_str = pcVar4;
  uVar2 = (*this->coreObject->_vptr_Core[0x3c])();
  local_54.hid = uVar2;
  if (uVar2 != 0x9aac0f00) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_40,&this->translators);
    this_00 = local_40.data;
    if (sVar7 == 0) {
      iVar3 = (*this->coreObject->_vptr_Core[0x28])(this->coreObject,(ulong)uVar2);
      pcVar4 = *(char **)CONCAT44(extraout_var,iVar3);
      sVar7 = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
    }
    searchValue._M_str = pcVar4;
    searchValue._M_len = sVar7;
    gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>::
    insert<helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
              ((StringMappedVector<helics::Translator,(reference_stability)0,5> *)this_00,
               searchValue,&this->fed,&local_50,&local_54);
    lVar5 = (long)((local_40.data)->dataStorage).bsize;
    ppTVar1 = ((local_40.data)->dataStorage).dataptr;
    if (lVar5 == 0) {
      pTVar6 = ppTVar1[(((local_40.data)->dataStorage).csize >> 5) - 1] + 0x1f;
    }
    else {
      pTVar6 = ppTVar1[((local_40.data)->dataStorage).dataSlotIndex] + lVar5 + -1;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_40.m_handle_lock);
    return pTVar6;
  }
  this_01 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register translator";
  message._M_len = 0x1d;
  RegistrationFailure::RegistrationFailure(this_01,message);
  __cxa_throw(this_01,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Translator& ConnectorFederateManager::registerTranslator(std::string_view name,
                                                         std::string_view endpointType,
                                                         std::string_view units)
{
    auto handle = coreObject->registerTranslator(name, endpointType, units);
    if (handle.isValid()) {
        auto trans = translators.lock();
        if (name.empty()) {
            trans->insert(coreObject->getHandleName(handle), fed, name, handle);
        } else {
            trans->insert(name, fed, name, handle);
        }
        return trans->back();
    }
    throw(RegistrationFailure("Unable to register translator"));
}